

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgssv.c
# Opt level: O1

void dgssv(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *perm_r,SuperMatrix *L,
          SuperMatrix *U,SuperMatrix *B,SuperLUStat_t *stat,int_t *info)

{
  double *pdVar1;
  int_t *piVar2;
  trans_t trans;
  SuperMatrix *L_00;
  SuperMatrix *U_00;
  int_t iVar3;
  int iVar4;
  int relax;
  int *etree;
  double dVar5;
  double dVar6;
  SuperMatrix *local_120;
  int i;
  int *local_f8;
  SuperMatrix *local_f0;
  SuperMatrix *local_e8;
  SuperMatrix *local_e0;
  int info1;
  SuperMatrix AC;
  GlobalLU_t Glu;
  
  *info = 0;
  iVar3 = -1;
  if (options->Fact == DOFACT) {
    iVar4 = A->nrow;
    iVar3 = -2;
    if ((((((-1 < iVar4) && (iVar4 == A->ncol)) && ((A->Stype & ~SLU_NR) == SLU_NC)) &&
         ((A->Dtype == SLU_D && (A->Mtype == SLU_GE)))) &&
        ((iVar3 = -7, -1 < B->ncol && ((iVar4 <= *B->Store && (B->Stype == SLU_DN)))))) &&
       ((B->Dtype == SLU_D && (B->Mtype == SLU_GE)))) goto LAB_0010acd3;
  }
  *info = iVar3;
LAB_0010acd3:
  if (*info == 0) {
    pdVar1 = stat->utime;
    local_e8 = L;
    if (A->Stype == SLU_NC) {
      trans = NOTRANS;
      local_120 = A;
    }
    else if (A->Stype == SLU_NR) {
      piVar2 = (int_t *)A->Store;
      local_120 = (SuperMatrix *)superlu_malloc(0x20);
      dCreate_CompCol_Matrix
                (local_120,A->ncol,A->nrow,*piVar2,*(double **)(piVar2 + 2),*(int_t **)(piVar2 + 4),
                 *(int_t **)(piVar2 + 6),SLU_NC,A->Dtype,A->Mtype);
      trans = TRANS;
    }
    else {
      *info = 1;
      input_error("dgssv",&i);
      trans = NOTRANS;
      local_120 = (SuperMatrix *)0x0;
    }
    local_e0 = U;
    dVar5 = SuperLU_timer_();
    if ((options->ColPerm != MY_PERMC) && (options->Fact == DOFACT)) {
      get_perm_c(options->ColPerm,local_120,perm_c);
    }
    dVar6 = SuperLU_timer_();
    *pdVar1 = dVar6 - dVar5;
    etree = int32Malloc(A->ncol);
    dVar5 = SuperLU_timer_();
    sp_preorder(options,local_120,perm_c,etree,&AC);
    dVar6 = SuperLU_timer_();
    pdVar1[3] = dVar6 - dVar5;
    iVar4 = sp_ienv(1);
    local_f0 = A;
    relax = sp_ienv(2);
    dVar5 = SuperLU_timer_();
    U_00 = local_e0;
    L_00 = local_e8;
    local_f8 = perm_c;
    dgstrf(options,&AC,relax,iVar4,etree,(void *)0x0,0,perm_c,perm_r,local_e8,local_e0,&Glu,stat,
           info);
    dVar6 = SuperLU_timer_();
    pdVar1[7] = dVar6 - dVar5;
    dVar5 = SuperLU_timer_();
    if (*info == 0) {
      dgstrs(trans,L_00,U_00,local_f8,perm_r,B,stat,&info1);
    }
    dVar6 = SuperLU_timer_();
    pdVar1[0x11] = dVar6 - dVar5;
    superlu_free(etree);
    Destroy_CompCol_Permuted(&AC);
    if (local_f0->Stype == SLU_NR) {
      Destroy_SuperMatrix_Store(local_120);
      superlu_free(local_120);
    }
  }
  else {
    i = -*info;
    input_error("dgssv",&i);
  }
  return;
}

Assistant:

void
dgssv(superlu_options_t *options, SuperMatrix *A, int *perm_c, int *perm_r,
      SuperMatrix *L, SuperMatrix *U, SuperMatrix *B,
      SuperLUStat_t *stat, int_t *info )
{

    DNformat *Bstore;
    SuperMatrix *AA;/* A in SLU_NC format used by the factorization routine.*/
    SuperMatrix AC; /* Matrix postmultiplied by Pc */
    int      lwork = 0, *etree, i;
    GlobalLU_t Glu; /* Not needed on return. */
    
    /* Set default values for some parameters */
    int      panel_size;     /* panel size */
    int      relax;          /* no of columns in a relaxed snodes */
    int      permc_spec;
    trans_t  trans = NOTRANS;
    double   *utime;
    double   t;	/* Temporary time */

    /* Test the input parameters ... */
    *info = 0;
    Bstore = B->Store;
    if ( options->Fact != DOFACT ) *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	 (A->Stype != SLU_NC && A->Stype != SLU_NR) ||
	 A->Dtype != SLU_D || A->Mtype != SLU_GE )
	*info = -2;
    else if ( B->ncol < 0 || Bstore->lda < SUPERLU_MAX(0, A->nrow) ||
	B->Stype != SLU_DN || B->Dtype != SLU_D || B->Mtype != SLU_GE )
	*info = -7;
    if ( *info != 0 ) {
	i = -(*info);
	input_error("dgssv", &i);
	return;
    }

    utime = stat->utime;

    /* Convert A to SLU_NC format when necessary. */
    if ( A->Stype == SLU_NR ) {
	NRformat *Astore = A->Store;
	AA = (SuperMatrix *) SUPERLU_MALLOC( sizeof(SuperMatrix) );
	dCreate_CompCol_Matrix(AA, A->ncol, A->nrow, Astore->nnz, 
			       Astore->nzval, Astore->colind, Astore->rowptr,
			       SLU_NC, A->Dtype, A->Mtype);
	trans = TRANS;
    } else if ( A->Stype == SLU_NC ) {
        AA = A;
    }
    /* A is of unsupported matrix format. */
    else {
        AA = NULL;
        *info = 1;
        input_error("dgssv", &i);
    }

    t = SuperLU_timer_();
    /*
     * Get column permutation vector perm_c[], according to permc_spec:
     *   permc_spec = NATURAL:  natural ordering 
     *   permc_spec = MMD_AT_PLUS_A: minimum degree on structure of A'+A
     *   permc_spec = MMD_ATA:  minimum degree on structure of A'*A
     *   permc_spec = COLAMD:   approximate minimum degree column ordering
     *   permc_spec = MY_PERMC: the ordering already supplied in perm_c[]
     */
    permc_spec = options->ColPerm;
    if ( permc_spec != MY_PERMC && options->Fact == DOFACT )
      get_perm_c(permc_spec, AA, perm_c);
    utime[COLPERM] = SuperLU_timer_() - t;

    etree = int32Malloc(A->ncol);

    t = SuperLU_timer_();
    sp_preorder(options, AA, perm_c, etree, &AC);
    utime[ETREE] = SuperLU_timer_() - t;

    panel_size = sp_ienv(1);
    relax = sp_ienv(2);

    /*printf("Factor PA = LU ... relax %d\tw %d\tmaxsuper %d\trowblk %d\n", 
	  relax, panel_size, sp_ienv(3), sp_ienv(4));*/
    t = SuperLU_timer_(); 
    /* Compute the LU factorization of A. */
    dgstrf(options, &AC, relax, panel_size, etree,
            NULL, lwork, perm_c, perm_r, L, U, &Glu, stat, info);
    utime[FACT] = SuperLU_timer_() - t;

    t = SuperLU_timer_();
    if ( *info == 0 ) {
        /* Solve the system A*X=B, overwriting B with X. */
	int info1;
        dgstrs (trans, L, U, perm_c, perm_r, B, stat, &info1);
    }
#if ( PRNTlevel>=1 )
     else {
        printf("dgstrf info %lld\n", (long long) *info); fflush(stdout);
    }
#endif
    
    utime[SOLVE] = SuperLU_timer_() - t;

    SUPERLU_FREE (etree);
    Destroy_CompCol_Permuted(&AC);
    if ( A->Stype == SLU_NR ) {
	Destroy_SuperMatrix_Store(AA);
	SUPERLU_FREE(AA);
    }

}